

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

bool __thiscall pbrt::SquareMatrix<4>::operator==(SquareMatrix<4> *this,SquareMatrix<4> *m2)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  uVar3 = 0;
  bVar5 = false;
  do {
    lVar4 = 0;
    do {
      fVar1 = (*(Float (*) [4])*(Float (*) [4])this)[lVar4];
      fVar2 = (*(Float (*) [4])*(Float (*) [4])m2)[lVar4];
      if (fVar1 != fVar2) {
        return bVar5;
      }
      if (NAN(fVar1) || NAN(fVar2)) {
        return bVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    bVar5 = 2 < uVar3;
    uVar3 = uVar3 + 1;
    this = (SquareMatrix<4> *)((long)this + 0x10);
    m2 = (SquareMatrix<4> *)((long)m2 + 0x10);
    if (uVar3 == 4) {
      return true;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return false;
        return true;
    }